

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void getSystemBasePath(char *path,uint pathLength,uint *subLength)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  
  uVar3 = 0;
  if (path != (char *)0x0 || subLength == (uint *)0x0) {
    if (path == (char *)0x0) {
      return;
    }
    uVar3 = 0;
    for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
      pcVar1 = getSystemBasePath::systemPaths[uVar2];
      pcVar5 = pcVar1 + ((ulong)"\t\v\x0f\x11"[uVar2 >> 1 & 0x7fffffff] - 1);
      for (uVar4 = (ulong)pathLength; (pcVar1 <= pcVar5 && (path <= path + (uVar4 - 1)));
          uVar4 = uVar4 - 1) {
        pcVar6 = pcVar1 + ((ulong)"\t\v\x0f\x11"[uVar2 >> 1 & 0x7fffffff] - 1);
        if (path[uVar4 - 1] == *pcVar5) {
          pcVar6 = pcVar5 + -1;
        }
        pcVar5 = pcVar6;
      }
      if (pcVar5 < pcVar1) {
        uVar3 = (int)uVar4 + (uint)"\x05\v"[uVar2 >> 2 & 0x3fffffff];
        break;
      }
    }
  }
  *subLength = uVar3;
  return;
}

Assistant:

void getSystemBasePath(const char * path, unsigned int pathLength, unsigned int * subLength)
{
    static const char * systemPaths[] = {
        "/usr/bin/",
        "/usr/lib/",
        "/usr/lib32/",
        "/usr/lib64/",
        "/usr/local/bin/",
        "/usr/local/lib/",
        "/usr/local/lib32/",
        "/usr/local/lib64/",
    };
    static unsigned char systemPathLengths[] = { 9, 11, 15, 17 };
    static unsigned char systemPathPrefixLength[] = { 5, 11 };

    if (!checkStringParameter(path, subLength))
    {
        return;
    }

    for (int i = 0; i < 8; ++i)
    {
        const char * systemPath = systemPaths[i];
        unsigned char systemPathLength = systemPathLengths[i >> 1];

        const char * iter = path + pathLength - 1;
        const char * resetSearchIter = systemPath + systemPathLength - 1;
        const char * searchIter = resetSearchIter;
        while (searchIter >= systemPath && iter >= path)
        {
            searchIter = *iter == *searchIter ? searchIter - 1 : resetSearchIter;
            --iter;
        }

        if (searchIter < systemPath) // sub-systemPath-string found
        {
            *subLength = (unsigned int)(iter - path) + systemPathPrefixLength[i >> 2] + 1;
            return;
        }
    }

    *subLength = 0;
}